

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roll-parser.cpp
# Opt level: O0

int __thiscall ORPG::ExpressionTree::parse_tree(ExpressionTree *this,parse_node *node)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  void *pvVar7;
  Die *pDVar8;
  double dVar9;
  int local_9c;
  Die *die_2;
  Die *die_1;
  int local_64;
  int sum;
  parse_node *curr;
  int ret;
  Die *die;
  int *results;
  int tmp;
  int reps;
  int size;
  int low;
  int limit;
  int i;
  int high;
  parse_node *node_local;
  ExpressionTree *this_local;
  
  local_64 = 0;
  if ((node != (parse_node *)0x0) && ((node->op != 0 || (node->value != 0)))) {
    switch(node->op) {
    default:
      if (((byte)Core::VB_FLAG & 1) != 0) {
        fprintf(_stderr,"Expression Parse Error: Invalid option - %c\n",(ulong)(uint)(int)node->op);
      }
      exit(1);
    case 1:
      local_64 = node->value;
      break;
    case 2:
      if (node->left == (parse_node *)0x0) {
        local_9c = 1;
      }
      else {
        local_9c = parse_tree(this,node->left);
      }
      iVar5 = parse_tree(this,node->right);
      if (local_9c != 0) {
        if ((iVar5 < 2) && (-2 < iVar5)) {
          local_64 = checked_sum(this,0,iVar5);
        }
        else {
          pDVar8 = (Die *)operator_new(4);
          Die::Die(pDVar8,iVar5);
          for (low = 0; low < local_9c; low = low + 1) {
            iVar5 = Die::roll(pDVar8);
            local_64 = checked_sum(this,local_64,iVar5);
          }
          if (pDVar8 != (Die *)0x0) {
            operator_delete__(pDVar8);
          }
        }
      }
      break;
    case 3:
      iVar5 = parse_tree(this,node->left);
      iVar3 = parse_tree(this,node->right);
      local_64 = checked_multiplication(this,iVar5,iVar3);
      break;
    case 4:
      iVar5 = parse_tree(this,node->left);
      iVar3 = parse_tree(this,node->right);
      dVar9 = std::ceil((double)(ulong)(uint)((float)iVar5 / (float)iVar3));
      local_64 = (int)SUB84(dVar9,0);
      break;
    case 5:
      iVar5 = parse_tree(this,node->left);
      iVar3 = parse_tree(this,node->right);
      local_64 = checked_sum(this,iVar5,iVar3);
      break;
    case 6:
      iVar5 = parse_tree(this,node->left);
      iVar3 = parse_tree(this,node->right);
      local_64 = checked_sum(this,iVar5,-iVar3);
      break;
    case 7:
      local_64 = parse_tree(this,node->left);
      iVar5 = parse_tree(this,node->right);
      local_64 = local_64 % iVar5;
      break;
    case 8:
      iVar5 = parse_tree(this,node->left->left);
      iVar3 = parse_tree(this,node->right);
      iVar4 = parse_tree(this,node->left->right);
      if (iVar5 != 0) {
        if ((iVar4 < 2) && (-2 < iVar4)) {
          local_64 = checked_sum(this,0,iVar4);
        }
        else {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = (long)iVar5;
          uVar6 = SUB168(auVar1 * ZEXT816(4),0);
          if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
            uVar6 = 0xffffffffffffffff;
          }
          pvVar7 = operator_new__(uVar6);
          if (pvVar7 == (void *)0x0) {
            printf("out of memory");
          }
          else {
            pDVar8 = (Die *)operator_new(4);
            Die::Die(pDVar8,iVar4);
            for (low = 0; low < iVar5; low = low + 1) {
              iVar4 = Die::roll(pDVar8);
              *(int *)((long)pvVar7 + (long)low * 4) = iVar4;
            }
            if (pDVar8 != (Die *)0x0) {
              operator_delete(pDVar8);
            }
            qsort(pvVar7,(long)iVar5,4,compare);
            for (low = iVar5 - iVar3; low < iVar5; low = low + 1) {
              local_64 = checked_sum(this,local_64,*(int *)((long)pvVar7 + (long)low * 4));
            }
            if (pvVar7 != (void *)0x0) {
              operator_delete__(pvVar7);
            }
          }
        }
      }
      break;
    case 9:
      iVar5 = parse_tree(this,node->left->left);
      iVar3 = parse_tree(this,node->right);
      iVar4 = parse_tree(this,node->left->right);
      if (iVar5 != 0) {
        if ((iVar4 < 2) && (-2 < iVar4)) {
          local_64 = checked_sum(this,0,iVar4);
        }
        else {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (long)iVar5;
          uVar6 = SUB168(auVar2 * ZEXT816(4),0);
          if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
            uVar6 = 0xffffffffffffffff;
          }
          pvVar7 = operator_new__(uVar6);
          if (pvVar7 == (void *)0x0) {
            printf("out of memory");
          }
          else {
            pDVar8 = (Die *)operator_new(4);
            Die::Die(pDVar8,iVar4);
            for (low = 0; low < iVar5; low = low + 1) {
              iVar4 = Die::roll(pDVar8);
              *(int *)((long)pvVar7 + (long)low * 4) = iVar4;
            }
            if (pDVar8 != (Die *)0x0) {
              operator_delete(pDVar8);
            }
            qsort(pvVar7,(long)iVar5,4,compare);
            for (low = 0; low < iVar3; low = low + 1) {
              local_64 = checked_sum(this,local_64,*(int *)((long)pvVar7 + (long)low * 4));
            }
            if (pvVar7 != (void *)0x0) {
              operator_delete__(pvVar7);
            }
          }
        }
      }
      break;
    case 10:
      iVar5 = parse_tree(this,node->right);
      results._4_4_ = parse_tree(this,node->left);
      while (results._4_4_ <= iVar5) {
        results._4_4_ = parse_tree(this,node->left);
      }
      local_64 = checked_sum(this,0,results._4_4_);
      break;
    case 0xb:
      iVar5 = parse_tree(this,node->right);
      results._4_4_ = parse_tree(this,node->left);
      while (results._4_4_ < iVar5) {
        results._4_4_ = parse_tree(this,node->left);
      }
      local_64 = checked_sum(this,0,results._4_4_);
      break;
    case 0xc:
      iVar5 = parse_tree(this,node->right);
      results._4_4_ = parse_tree(this,node->left);
      while (iVar5 <= results._4_4_) {
        results._4_4_ = parse_tree(this,node->left);
      }
      local_64 = checked_sum(this,0,results._4_4_);
      break;
    case 0xd:
      iVar5 = parse_tree(this,node->right);
      results._4_4_ = parse_tree(this,node->left);
      while (iVar5 < results._4_4_) {
        results._4_4_ = parse_tree(this,node->left);
      }
      local_64 = checked_sum(this,0,results._4_4_);
      break;
    case 0xe:
      iVar5 = parse_tree(this,node->right);
      results._4_4_ = parse_tree(this,node->left);
      while (results._4_4_ == iVar5) {
        results._4_4_ = parse_tree(this,node->left);
      }
      return 0;
    case -0xffff0001:
      return 0;
    }
    iVar5 = checked_sum(this,0,local_64);
    return iVar5;
  }
  return 0;
}

Assistant:

int ExpressionTree::parse_tree(struct parse_node* node) {
        int high;
        int i;
        int limit;
        int low;
        int size;
        int reps;
        int tmp;
        int* results;
        Die* die;

        int ret = 0;

        /* sets our current node to node */
        auto curr = node;

        int sum = 0;

        if(!curr || (!curr->op && !curr->value)) {
            return 0;
        }

        switch(curr->op) {
        // error node
        case OP_ERR: {
            return 0;
        } break;

        // number node
        case OP_NUMBER: {
            sum = curr->value;
        } break;

        // n-sided die node
        case OP_DIE: {
            reps = curr->left ? parse_tree(curr->left) : 1;
            size = parse_tree(curr->right);

            if(reps == 0) {
                break;
            }

            if(size < 2 && size > -2) {
                sum = checked_sum(sum, size);
                break;
            }

            die = new Die(size); 
            
            for(i = 0; i < reps; i++) {
                sum = checked_sum(sum, die->roll());
            }
            
            delete[] die;
        } break;

        // multiplication node
        case OP_TIMES: {
            sum = checked_multiplication(parse_tree(curr->left),
                                         parse_tree(curr->right));
        } break;

        // integer division node
        case OP_DIV: {
            sum = (int)
            ceil((float)parse_tree(curr->left) /
                        parse_tree(curr->right));
        } break;
        
        // addition node
        case OP_PLUS: {
            sum = checked_sum(parse_tree(curr->left),
                              parse_tree(curr->right));
        } break;
        
        // subtraction node
        case OP_MINUS: {
            sum = checked_sum(parse_tree(curr->left),
                             -parse_tree(curr->right));
        } break;

        // modulo node
        case OP_MOD: {
            sum = parse_tree(curr->left) % parse_tree(curr->right);
        } break;
        
        // keep highest results node
        case OP_HIGH: {
            reps = parse_tree(curr->left->left);
            high = parse_tree(curr->right);
            size = parse_tree(curr->left->right);

            if(reps == 0) {
                break;
            }

            if(size < 2 && size > -2) {
                sum = checked_sum(sum, size);
                break;
            }

            // array to store the results to sort
            if (!(results = new int[reps])) {
                printf("out of memory");
                break;
            }
        
            Die* die = new Die(size);

            for(i = 0; i < reps; i++) {
                results[i] = die->roll();
            }

            delete die;

            qsort(results, reps, sizeof(int), &compare);

            for(i = (reps - high); i < reps; i++) {
                sum = checked_sum(sum, results[i]);
            }
        
            delete[] results;
        } break;
            
        // keep lowest resutls node
        case OP_LOW: {
            reps    = parse_tree(curr->left->left);
            low     = parse_tree(curr->right);
            size    = parse_tree(curr->left->right);

            if(reps == 0) {
                break;
            }

            if(size < 2 && size > -2) {
                sum = checked_sum(sum, size);
                break;
            }
                    
            /* array to store the results to sort */
            if (!(results = new int[reps])) {
                printf("out of memory");
                break;
            }
        
            Die* die = new Die(size);

            for(i = 0; i < reps; i++) {
                results[i] = die->roll();
            }

            delete die;

            qsort(results, reps, sizeof(int), &compare);
        
            for(i = 0; i < low; i++) {
                sum = checked_sum(sum, results[i]);
            }
        
            delete[] results;
        } break;

        // keep results greater than
        case OP_GT: {
            limit = parse_tree(curr->right);      
            tmp   = parse_tree(curr->left);
                
            while (tmp <= limit) {
                tmp = parse_tree(curr->left);
            }
                
            sum = checked_sum(sum, tmp);
        } break;

        // keep results greater or equal than
        case OP_GE: {
            limit = parse_tree(curr->right);      
            tmp   = parse_tree(curr->left);
            
            while (tmp < limit) {
                tmp = parse_tree(curr->left);
            }
        
            sum = checked_sum( sum, tmp );
        } break;
            
        // keep results less than
        case OP_LT: {
            limit = parse_tree(curr->right);      
            tmp   = parse_tree(curr->left);
        
            while (tmp >= limit) {
                tmp = parse_tree(curr->left);
            }
        
            sum = checked_sum(sum, tmp);
        
        } break;
        
        // keep results less or equal than
        case OP_LE: {
            limit = parse_tree(curr->right);      
            tmp   = parse_tree(curr->left);
        
            while (tmp > limit) {
                tmp = parse_tree(curr->left);
            }
        
            sum = checked_sum(sum, tmp);
        } break;
        
        // keep result not equal to
        case OP_NE: {
            limit = parse_tree(curr->right);      
            tmp   = parse_tree(curr->left);
        
            while (tmp == limit) {
                tmp = parse_tree(curr->left);      
            }
        
            return ret;
        } break;

        default: {
            if(Core::VB_FLAG) fprintf(stderr, "Expression Parse Error: Invalid option - %c\n", curr->op);
            exit(EXIT_FAILURE);
        }
        }

        ret = checked_sum(ret, sum);

        return ret;
    }